

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O1

int __thiscall
absl::lts_20250127::Cord::CompareSlowPath
          (Cord *this,Cord *rhs,size_t compared_size,size_t size_to_compare)

{
  byte bVar1;
  Nonnull<cord_internal::CordRep_*> pCVar2;
  uint uVar3;
  size_t sVar4;
  undefined4 uVar5;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 uVar6;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 uVar7;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 uVar8;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  string_view rhs_chunk;
  string_view lhs_chunk;
  ChunkIterator rhs_it;
  ChunkIterator lhs_it;
  basic_string_view<char,_std::char_traits<char>_> local_198;
  basic_string_view<char,_std::char_traits<char>_> local_188;
  size_t local_170;
  ChunkIterator local_168;
  ChunkIterator local_c8;
  
  local_170 = size_to_compare;
  uVar5 = 0;
  uVar6 = 0;
  uVar7 = 0;
  uVar8 = 0;
  local_c8.current_leaf_ = (Nullable<absl::cord_internal::CordRep_*>)0x0;
  local_c8.bytes_remaining_ = 0;
  local_c8.current_chunk_ = (string_view)ZEXT816(0);
  local_c8.btree_reader_.remaining_ = 0;
  local_c8.btree_reader_.navigator_.height_ = -1;
  bVar1 = (this->contents_).data_.rep_.field_0.data[0];
  pCVar2 = (this->contents_).data_.rep_.field_0.as_tree.rep;
  if (pCVar2 == (Nonnull<cord_internal::CordRep_*>)0x0 || ((long)(char)bVar1 & 1U) == 0) {
    if ((bVar1 & 1) != 0) goto LAB_00324784;
    local_c8.bytes_remaining_ = (ulong)(long)(char)bVar1 >> 1;
    local_c8.current_chunk_._M_str = (char *)((long)&(this->contents_).data_.rep_.field_0 + 1);
    local_c8.current_chunk_._M_len = local_c8.bytes_remaining_;
  }
  else {
    local_c8.bytes_remaining_ = pCVar2->length;
    if (pCVar2->length == 0) goto LAB_00324789;
    ChunkIterator::InitTree(&local_c8,pCVar2);
  }
  do {
    uVar5 = 0;
    uVar6 = 0;
    uVar7 = 0;
    uVar8 = 0;
    local_168.current_leaf_ = (Nullable<absl::cord_internal::CordRep_*>)0x0;
    local_168.bytes_remaining_ = 0;
    local_168.current_chunk_ = (string_view)ZEXT816(0);
    local_168.btree_reader_.remaining_ = 0;
    local_168.btree_reader_.navigator_.height_ = -1;
    bVar1 = (byte)((Nonnull<absl::string_view_*>)rhs)->_M_len;
    pCVar2 = (Nonnull<cord_internal::CordRep_*>)((Nonnull<absl::string_view_*>)rhs)->_M_str;
    if (pCVar2 == (Nonnull<cord_internal::CordRep_*>)0x0 || ((long)(char)bVar1 & 1U) == 0) {
      if ((bVar1 & 1) == 0) {
        local_168.bytes_remaining_ = (ulong)(long)(char)bVar1 >> 1;
        local_168.current_chunk_._M_str =
             (char *)((long)&((Nonnull<absl::string_view_*>)rhs)->_M_len + 1);
        local_168.current_chunk_._M_len = local_168.bytes_remaining_;
      }
      else {
        CompareSlowPath();
        uVar5 = extraout_XMM0_Da_00;
        uVar6 = extraout_XMM0_Db_00;
        uVar7 = extraout_XMM0_Dc_00;
        uVar8 = extraout_XMM0_Dd_00;
LAB_0032479b:
        local_168.current_chunk_._M_len._4_4_ = uVar6;
        local_168.current_chunk_._M_len._0_4_ = uVar5;
        local_168.current_chunk_._M_str._0_4_ = uVar7;
        local_168.current_chunk_._M_str._4_4_ = uVar8;
      }
    }
    else {
      local_168.bytes_remaining_ = pCVar2->length;
      if (pCVar2->length == 0) goto LAB_0032479b;
      ChunkIterator::InitTree(&local_168,pCVar2);
    }
    if (local_c8.bytes_remaining_ == 0) {
      local_188._M_len = 0;
      local_188._M_str = (char *)0x0;
    }
    else {
      local_188._M_len = local_c8.current_chunk_._M_len;
      local_188._M_str = local_c8.current_chunk_._M_str;
    }
    if (local_168.bytes_remaining_ == 0) {
      local_198._M_len = 0;
      local_198._M_str = (char *)0x0;
    }
    else {
      local_198._M_len = local_168.current_chunk_._M_len;
      local_198._M_str = local_168.current_chunk_._M_str;
    }
    if (local_188._M_len < compared_size) {
      __assert_fail("compared_size <= lhs_chunk.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/cord.cc"
                    ,0x3b6,"int absl::Cord::CompareSlowPath(const Cord &, size_t, size_t) const");
    }
    sVar4 = local_198._M_len - compared_size;
    if (local_198._M_len < compared_size) {
      __assert_fail("compared_size <= rhs_chunk.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/cord.cc"
                    ,0x3b7,"int absl::Cord::CompareSlowPath(const Cord &, size_t, size_t) const");
    }
    rhs = (Cord *)&local_188;
    local_188._M_str = local_188._M_str + compared_size;
    local_188._M_len = local_188._M_len - compared_size;
    local_198._M_str = local_198._M_str + compared_size;
    size_to_compare = size_to_compare - compared_size;
    compared_size = (size_t)&local_170;
    local_170 = size_to_compare;
    local_198._M_len = sVar4;
    while (local_188._M_len != 0) {
LAB_003246b4:
      if (local_198._M_len == 0) {
        if (local_168.bytes_remaining_ == 0) goto LAB_0032477f;
        sVar4 = local_168.bytes_remaining_ - local_168.current_chunk_._M_len;
        if (local_168.bytes_remaining_ < local_168.current_chunk_._M_len) {
LAB_003247a5:
          __assert_fail("bytes_remaining_ >= current_chunk_.size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/cord.h"
                        ,0x611,"Cord::ChunkIterator &absl::Cord::ChunkIterator::operator++()");
        }
        local_168.bytes_remaining_ = sVar4;
        if (sVar4 != 0) {
          if (((long)local_168.btree_reader_.navigator_.height_ < 0) ||
             (local_168.btree_reader_.navigator_.node_[local_168.btree_reader_.navigator_.height_]
              == (CordRepBtree *)0x0)) {
            if (local_168.current_chunk_._M_len == 0) {
LAB_003247c4:
              __assert_fail("!current_chunk_.empty()",
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/cord.h"
                            ,0x617,"Cord::ChunkIterator &absl::Cord::ChunkIterator::operator++()");
            }
            local_168.current_chunk_ = (string_view)ZEXT816(0);
          }
          else {
            local_168.current_chunk_ =
                 cord_internal::CordRepBtreeReader::Next(&local_168.btree_reader_);
          }
        }
        if (local_168.bytes_remaining_ == 0) goto LAB_00324753;
        local_198._M_len = local_168.current_chunk_._M_len;
        local_198._M_str = local_168.current_chunk_._M_str;
      }
      uVar3 = anon_unknown_74::CompareChunks
                        ((Nonnull<absl::string_view_*>)rhs,&local_198,
                         (Nonnull<size_t_*>)compared_size);
      size_to_compare = size_to_compare & 0xffffffff;
      if (local_170 == 0) {
        size_to_compare = 0;
      }
      if (uVar3 != 0) {
        size_to_compare = (size_t)uVar3;
        goto LAB_00324766;
      }
      if (local_170 == 0) {
LAB_00324766:
        return (int)size_to_compare;
      }
    }
    if (local_c8.bytes_remaining_ != 0) {
      sVar4 = local_c8.bytes_remaining_ - local_c8.current_chunk_._M_len;
      if (local_c8.bytes_remaining_ < local_c8.current_chunk_._M_len) goto LAB_003247a5;
      local_c8.bytes_remaining_ = sVar4;
      if (sVar4 != 0) {
        if (((long)local_c8.btree_reader_.navigator_.height_ < 0) ||
           (local_c8.btree_reader_.navigator_.node_[local_c8.btree_reader_.navigator_.height_] ==
            (CordRepBtree *)0x0)) {
          if (local_c8.current_chunk_._M_len == 0) goto LAB_003247c4;
          local_c8.current_chunk_ = (string_view)ZEXT816(0);
        }
        else {
          local_c8.current_chunk_ = cord_internal::CordRepBtreeReader::Next(&local_c8.btree_reader_)
          ;
        }
      }
      if (local_c8.bytes_remaining_ != 0) {
        local_188._M_len = local_c8.current_chunk_._M_len;
        local_188._M_str = local_c8.current_chunk_._M_str;
        goto LAB_003246b4;
      }
LAB_00324753:
      size_to_compare = (size_t)((uint)(local_198._M_len == 0) - (uint)(local_188._M_len == 0));
      goto LAB_00324766;
    }
    CompareSlowPath();
LAB_0032477f:
    CompareSlowPath();
LAB_00324784:
    CompareSlowPath();
    uVar5 = extraout_XMM0_Da;
    uVar6 = extraout_XMM0_Db;
    uVar7 = extraout_XMM0_Dc;
    uVar8 = extraout_XMM0_Dd;
LAB_00324789:
    local_c8.current_chunk_._M_len._4_4_ = uVar6;
    local_c8.current_chunk_._M_len._0_4_ = uVar5;
    local_c8.current_chunk_._M_str._0_4_ = uVar7;
    local_c8.current_chunk_._M_str._4_4_ = uVar8;
  } while( true );
}

Assistant:

inline int Cord::CompareSlowPath(const Cord& rhs, size_t compared_size,
                                 size_t size_to_compare) const {
  auto advance = [](absl::Nonnull<Cord::ChunkIterator*> it,
                    absl::Nonnull<absl::string_view*> chunk) {
    if (!chunk->empty()) return true;
    ++*it;
    if (it->bytes_remaining_ == 0) return false;
    *chunk = **it;
    return true;
  };

  Cord::ChunkIterator lhs_it = chunk_begin();
  Cord::ChunkIterator rhs_it = rhs.chunk_begin();

  // compared_size is inside both first chunks.
  absl::string_view lhs_chunk =
      (lhs_it.bytes_remaining_ != 0) ? *lhs_it : absl::string_view();
  absl::string_view rhs_chunk =
      (rhs_it.bytes_remaining_ != 0) ? *rhs_it : absl::string_view();
  assert(compared_size <= lhs_chunk.size());
  assert(compared_size <= rhs_chunk.size());
  lhs_chunk.remove_prefix(compared_size);
  rhs_chunk.remove_prefix(compared_size);
  size_to_compare -= compared_size;  // skip already compared size.

  while (advance(&lhs_it, &lhs_chunk) && advance(&rhs_it, &rhs_chunk)) {
    int memcmp_res = CompareChunks(&lhs_chunk, &rhs_chunk, &size_to_compare);
    if (memcmp_res != 0) return memcmp_res;
    if (size_to_compare == 0) return 0;
  }

  return static_cast<int>(rhs_chunk.empty()) -
         static_cast<int>(lhs_chunk.empty());
}